

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O0

bool duckdb::HugeintTryCastInteger<int,_true>(hugeint_t input,int *result)

{
  int iVar1;
  unsigned_long uVar2;
  int *in_RDX;
  long in_RSI;
  ulong in_RDI;
  
  if (in_RSI == -1) {
    uVar2 = NumericLimits<unsigned_long>::Maximum();
    iVar1 = NumericLimits<int>::Maximum();
    if (uVar2 - (long)iVar1 <= in_RDI) {
      uVar2 = NumericLimits<unsigned_long>::Maximum();
      *in_RDX = -1 - ((int)uVar2 - (int)in_RDI);
      return true;
    }
  }
  else if ((in_RSI == 0) && (iVar1 = NumericLimits<int>::Maximum(), in_RDI <= (ulong)(long)iVar1)) {
    *in_RDX = (int)in_RDI;
    return true;
  }
  return false;
}

Assistant:

bool HugeintTryCastInteger(hugeint_t input, DST &result) {
	switch (input.upper) {
	case 0:
		// positive number: check if the positive number is in range
		if (input.lower <= uint64_t(NumericLimits<DST>::Maximum())) {
			result = DST(input.lower);
			return true;
		}
		break;
	case -1:
		if (!SIGNED) {
			return false;
		}
		// negative number: check if the negative number is in range
		if (input.lower >= NumericLimits<uint64_t>::Maximum() - uint64_t(NumericLimits<DST>::Maximum())) {
			result = -DST(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}